

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTab.cpp
# Opt level: O2

TypeDescriptor * __thiscall SymTab::getValueFor(SymTab *this,string *vName)

{
  bool bVar1;
  mapped_type *ppTVar2;
  ostream *poVar3;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)vName);
  bVar1 = isDefined(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    ppTVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
              ::operator[](&this->symTab,vName);
    return *ppTVar2;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"SymTab::getValueFor: ");
  poVar3 = std::operator<<(poVar3,(string *)vName);
  std::operator<<(poVar3," has not been defined.\n");
  exit(1);
}

Assistant:

TypeDescriptor *SymTab::getValueFor(std::string vName) {
    if( ! isDefined(vName)) {
        std::cout << "SymTab::getValueFor: " << vName << " has not been defined.\n";
        exit(1);
    }
    TypeDescriptor *value = symTab[vName];
//    if(value->type() == TypeDescriptor::NUMBER) {
//        double numValue = value->getNumber();
//        std::cout << "SymTab::getValueFor: " << vName << " contains " << numValue << std::endl;
//    } else if(value->type() == TypeDescriptor::BOOLEAN) {
//        if(value->getBoolean())
//            std::cout << "SymTab::getValueFor: " << vName << " contains true" << std::endl;
//        else{
//            std::cout << "SymTab::getValueFor: " << vName << " contains false" << std::endl;
//        }
//    }else{
//        std::string stringValue = value->getString();
//        std::cout << "SymTab::getValueFor: " << vName << " contains " << stringValue << std::endl;
//
//    }
    return value;

}